

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O0

bool P_GetMidTexturePosition(line_t_conflict *line,int sideno,double *ptextop,double *ptexbot)

{
  bool bVar1;
  int iVar2;
  FTexture *this;
  double dVar3;
  double dVar4;
  double dVar5;
  double textureheight;
  double y_offset;
  double totalscale;
  FTexture *tex;
  side_t *psStack_38;
  FTextureID texnum;
  side_t *side;
  double *ptexbot_local;
  double *ptextop_local;
  int sideno_local;
  line_t_conflict *line_local;
  
  if ((line->sidedef[0] == (side_t *)0x0) || (line->sidedef[1] == (side_t *)0x0)) {
    line_local._7_1_ = false;
  }
  else {
    psStack_38 = line->sidedef[sideno];
    tex._4_4_ = side_t::GetTexture(psStack_38,1);
    bVar1 = FTextureID::isValid((FTextureID *)((long)&tex + 4));
    if (bVar1) {
      this = FTextureManager::operator()(&TexMan,tex._4_4_,false);
      if (this == (FTexture *)0x0) {
        line_local._7_1_ = false;
      }
      else {
        dVar3 = side_t::GetTextureYScale(psStack_38,1);
        dVar4 = FTexture::GetScaleY(this);
        dVar4 = ABS(dVar3) * dVar4;
        textureheight = side_t::GetTextureYOffset(psStack_38,1);
        iVar2 = FTexture::GetHeight(this);
        if (((dVar4 != 1.0) || (NAN(dVar4))) && ((*(ushort *)&this->field_0x31 >> 2 & 1) == 0)) {
          textureheight = textureheight / dVar4;
        }
        if ((line->flags & 0x10) == 0) {
          dVar3 = sector_t::GetPlaneTexZ((sector_t *)line->frontsector,1);
          dVar5 = sector_t::GetPlaneTexZ((sector_t *)line->backsector,1);
          dVar3 = MIN<double>(dVar3,dVar5);
          *ptextop = textureheight + dVar3;
          *ptexbot = *ptextop - (double)iVar2 / dVar4;
        }
        else {
          dVar3 = sector_t::GetPlaneTexZ((sector_t *)line->frontsector,0);
          dVar5 = sector_t::GetPlaneTexZ((sector_t *)line->backsector,0);
          dVar3 = MAX<double>(dVar3,dVar5);
          *ptexbot = textureheight + dVar3;
          *ptextop = *ptexbot + (double)iVar2 / dVar4;
        }
        line_local._7_1_ = true;
      }
    }
    else {
      line_local._7_1_ = false;
    }
  }
  return line_local._7_1_;
}

Assistant:

bool P_GetMidTexturePosition(const line_t *line, int sideno, double *ptextop, double *ptexbot)
{
	if (line->sidedef[0]==NULL || line->sidedef[1]==NULL) return false;
	
	side_t *side = line->sidedef[sideno];
	FTextureID texnum = side->GetTexture(side_t::mid);
	if (!texnum.isValid()) return false;
	FTexture * tex= TexMan(texnum);
	if (!tex) return false;

	double totalscale = fabs(side->GetTextureYScale(side_t::mid)) * tex->GetScaleY();
	double y_offset = side->GetTextureYOffset(side_t::mid);
	double textureheight = tex->GetHeight() / totalscale;
	if (totalscale != 1. && !tex->bWorldPanning)
	{ 
		y_offset /= totalscale;
	}

	if(line->flags & ML_DONTPEGBOTTOM)
	{
		*ptexbot = y_offset +
			MAX(line->frontsector->GetPlaneTexZ(sector_t::floor), line->backsector->GetPlaneTexZ(sector_t::floor));

		*ptextop = *ptexbot + textureheight;
	}
	else
	{
		*ptextop = y_offset +
		   MIN(line->frontsector->GetPlaneTexZ(sector_t::ceiling), line->backsector->GetPlaneTexZ(sector_t::ceiling));
		
		*ptexbot = *ptextop - textureheight;
	}
	return true;
}